

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRTC6845.hpp
# Opt level: O0

void __thiscall
Motorola::CRTC::
CRTC6845<PCCompatible::MDA::CRTCOutputter,_(Motorola::CRTC::Personality)0,_(Motorola::CRTC::CursorType)1>
::run_for(CRTC6845<PCCompatible::MDA::CRTCOutputter,_(Motorola::CRTC::Personality)0,_(Motorola::CRTC::CursorType)1>
          *this,Cycles cycles)

{
  bool local_29;
  long local_20;
  IntType cyles_remaining;
  CRTC6845<PCCompatible::MDA::CRTCOutputter,_(Motorola::CRTC::Personality)0,_(Motorola::CRTC::CursorType)1>
  *this_local;
  Cycles cycles_local;
  
  this_local = (CRTC6845<PCCompatible::MDA::CRTCOutputter,_(Motorola::CRTC::Personality)0,_(Motorola::CRTC::CursorType)1>
                *)cycles.super_WrappedInt<Cycles>.length_;
  local_20 = WrappedInt<Cycles>::as_integral((WrappedInt<Cycles> *)&this_local);
  while (local_20 != 0) {
    if (this->character_counter_ == (this->layout_).horizontal.displayed) {
      this->character_is_visible_ = false;
      this->end_of_line_address_ = (this->bus_state_).refresh_address;
    }
    perform_bus_cycle_phase1(this);
    (this->bus_state_).refresh_address = (this->bus_state_).refresh_address + 1 & 0x3fff;
    local_29 = false;
    if ((this->is_cursor_line_ & 1U) != 0) {
      local_29 = (this->bus_state_).refresh_address == (this->layout_).cursor_address;
    }
    (this->bus_state_).cursor = local_29;
    if (this->character_counter_ == (this->layout_).horizontal.total) {
      this->character_counter_ = '\0';
      do_end_of_line(this);
      this->character_is_visible_ = true;
    }
    else {
      this->character_counter_ = this->character_counter_ + '\x01';
    }
    if (this->character_counter_ == (this->layout_).horizontal.start_sync) {
      this->hsync_counter_ = 0;
      (this->bus_state_).hsync = true;
    }
    if (((this->bus_state_).hsync & 1U) != 0) {
      (this->bus_state_).hsync = this->hsync_counter_ != (uint)(this->layout_).horizontal.sync_width
      ;
      this->hsync_counter_ = this->hsync_counter_ + 1U & 0xf;
    }
    perform_bus_cycle_phase2(this);
    local_20 = local_20 + -1;
  }
  return;
}

Assistant:

void run_for(Cycles cycles) {
			auto cyles_remaining = cycles.as_integral();
			while(cyles_remaining--) {
				// Check for end of visible characters.
				if(character_counter_ == layout_.horizontal.displayed) {
					// TODO: consider skew in character_is_visible_. Or maybe defer until perform_bus_cycle?
					character_is_visible_ = false;
					end_of_line_address_ = bus_state_.refresh_address;
				}

				perform_bus_cycle_phase1();
				bus_state_.refresh_address = (bus_state_.refresh_address + 1) & RefreshMask;

				bus_state_.cursor = is_cursor_line_ &&
					bus_state_.refresh_address == layout_.cursor_address;

				// Check for end-of-line.
				if(character_counter_ == layout_.horizontal.total) {
					character_counter_ = 0;
					do_end_of_line();
					character_is_visible_ = true;
				} else {
					// Increment counter.
					character_counter_++;
				}

				// Check for start of horizontal sync.
				if(character_counter_ == layout_.horizontal.start_sync) {
					hsync_counter_ = 0;
					bus_state_.hsync = true;
				}

				// Check for end of horizontal sync; note that a sync time of zero will result in an immediate
				// cancellation of the plan to perform sync if this is an HD6845S or UM6845R; otherwise zero
				// will end up counting as 16 as it won't be checked until after overflow.
				if(bus_state_.hsync) {
					switch(personality) {
						case Personality::HD6845S:
						case Personality::UM6845R:
							bus_state_.hsync = hsync_counter_ != layout_.horizontal.sync_width;
							hsync_counter_ = (hsync_counter_ + 1) & 15;
						break;
						default:
							hsync_counter_ = (hsync_counter_ + 1) & 15;
							bus_state_.hsync = hsync_counter_ != layout_.horizontal.sync_width;
						break;
					}
				}

				perform_bus_cycle_phase2();
			}
		}